

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O2

int run_container_negation_range
              (run_container_t *src,int range_start,int range_end,container_t **dst)

{
  undefined8 in_RAX;
  run_container_t *prVar1;
  container_t *pcVar2;
  uint uVar3;
  long lVar4;
  undefined8 uStack_38;
  uint8_t return_typecode;
  
  if (range_start < range_end) {
    uStack_38 = in_RAX;
    prVar1 = run_container_create_given_capacity(src->n_runs + 1);
    lVar4 = 0;
    while ((lVar4 < src->n_runs && ((int)(uint)src->runs[lVar4].value < range_start))) {
      prVar1->runs[lVar4] = src->runs[lVar4];
      prVar1->n_runs = prVar1->n_runs + 1;
      lVar4 = lVar4 + 1;
    }
    run_container_smart_append_exclusive
              (prVar1,(ushort)range_start,~(ushort)range_start + (short)range_end);
    for (; lVar4 < src->n_runs; lVar4 = lVar4 + 1) {
      run_container_smart_append_exclusive(prVar1,src->runs[lVar4].value,src->runs[lVar4].length);
    }
    pcVar2 = convert_run_to_efficient_container(prVar1,&return_typecode);
    *dst = pcVar2;
    uVar3 = (uint)return_typecode;
    if (return_typecode != '\x03') {
      run_container_free(prVar1);
    }
  }
  else {
    prVar1 = run_container_clone(src);
    *dst = prVar1;
    uVar3 = 3;
  }
  return uVar3;
}

Assistant:

int run_container_negation_range(
    const run_container_t *src,
    const int range_start, const int range_end,
    container_t **dst
){
    uint8_t return_typecode;

    // follows the Java implementation
    if (range_end <= range_start) {
        *dst = run_container_clone(src);
        return RUN_CONTAINER_TYPE;
    }

    run_container_t *ans = run_container_create_given_capacity(
        src->n_runs + 1);  // src->n_runs + 1);
    int k = 0;
    for (; k < src->n_runs && src->runs[k].value < range_start; ++k) {
        ans->runs[k] = src->runs[k];
        ans->n_runs++;
    }

    run_container_smart_append_exclusive(
        ans, (uint16_t)range_start, (uint16_t)(range_end - range_start - 1));

    for (; k < src->n_runs; ++k) {
        run_container_smart_append_exclusive(ans, src->runs[k].value,
                                             src->runs[k].length);
    }

    *dst = convert_run_to_efficient_container(ans, &return_typecode);
    if (return_typecode != RUN_CONTAINER_TYPE) run_container_free(ans);

    return return_typecode;
}